

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccpp.c
# Opt level: O2

CachedInclude * search_cached_include(TCCState *s1,char *filename,int add)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  CachedInclude *pCVar4;
  byte *pbVar5;
  int *piVar6;
  int *piVar7;
  
  uVar1 = 1;
  for (pbVar5 = (byte *)filename; *pbVar5 != 0; pbVar5 = pbVar5 + 1) {
    uVar1 = (uVar1 >> 0x1b) + uVar1 * 0x21 + (uint)*pbVar5;
  }
  piVar7 = s1->cached_includes_hash + (uVar1 & 0x1f);
  piVar6 = piVar7;
  while( true ) {
    if ((long)*piVar6 == 0) {
      if (add == 0) {
        pCVar4 = (CachedInclude *)0x0;
      }
      else {
        sVar3 = strlen(filename);
        pCVar4 = (CachedInclude *)tcc_malloc(sVar3 + 0x10);
        strcpy(pCVar4->filename,filename);
        pCVar4->ifndef_macro = 0;
        pCVar4->once = 0;
        dynarray_add(&s1->cached_includes,&s1->nb_cached_includes,pCVar4);
        pCVar4->hash_next = *piVar7;
        *piVar7 = s1->nb_cached_includes;
      }
      return pCVar4;
    }
    pCVar4 = s1->cached_includes[(long)*piVar6 + -1];
    iVar2 = strcmp(pCVar4->filename,filename);
    if (iVar2 == 0) break;
    piVar6 = &pCVar4->hash_next;
  }
  return pCVar4;
}

Assistant:

static CachedInclude* search_cached_include(TCCState* s1, const char* filename, int add) {
  const unsigned char* s;
  unsigned int h;
  CachedInclude* e;
  int i;

  h = TOK_HASH_INIT;
  s = (unsigned char*)filename;
  while (*s) {
#ifdef _WIN32
    h = TOK_HASH_FUNC(h, toup(*s));
#else
    h = TOK_HASH_FUNC(h, *s);
#endif
    s++;
  }
  h &= (CACHED_INCLUDES_HASH_SIZE - 1);

  i = s1->cached_includes_hash[h];
  for (;;) {
    if (i == 0)
      break;
    e = s1->cached_includes[i - 1];
    if (0 == PATHCMP(e->filename, filename))
      return e;
    i = e->hash_next;
  }
  if (!add)
    return NULL;

  e = tcc_malloc(sizeof(CachedInclude) + strlen(filename));
  strcpy(e->filename, filename);
  e->ifndef_macro = e->once = 0;
  dynarray_add(&s1->cached_includes, &s1->nb_cached_includes, e);
  /* add in hash table */
  e->hash_next = s1->cached_includes_hash[h];
  s1->cached_includes_hash[h] = s1->nb_cached_includes;
#ifdef INC_DEBUG
  printf("adding cached '%s'\n", filename);
#endif
  return e;
}